

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FeatureSet * __thiscall google::protobuf::Symbol::features(Symbol *this)

{
  byte bVar1;
  
  bVar1 = this->ptr_->symbol_type_ - 1;
  if ((bVar1 < 9) && ((0x1dfU >> (bVar1 & 0x1f) & 1) != 0)) {
    return *(FeatureSet **)(this->ptr_ + *(long *)(&DAT_0064c0d0 + (ulong)bVar1 * 8));
  }
  features();
}

Assistant:

Type type() const { return static_cast<Type>(ptr_->symbol_type_); }